

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

int lws_vhost_active_conns(lws *wsi,lws **nwsi,char *adsin)

{
  int iVar1;
  uint uVar2;
  lws *plVar3;
  uint uVar4;
  lws_dll2_owner *plVar5;
  lws *local_48;
  lws *w_1;
  lws_dll2 *d1;
  lws_dll2 *d;
  lws *w;
  char *adsin_local;
  lws **nwsi_local;
  lws *wsi_local;
  
  w = (lws *)adsin;
  adsin_local = (char *)nwsi;
  nwsi_local = (lws **)wsi;
  iVar1 = lws_dll2_is_detached(&wsi->dll2_cli_txn_queue);
  if (iVar1 == 0) {
    *(lws_dll2 ***)adsin_local = &nwsi_local[0x3b][-1].sul_hrtimer.list.next;
    wsi_local._4_4_ = 2;
  }
  else if (nwsi_local[0x17] == (lws *)0x0) {
    d1 = *(lws_dll2 **)&(nwsi_local[0x40]->dll2_cli_txn_queue_owner).count;
    while (d1 != (lws_dll2 *)0x0) {
      w_1 = (lws *)d1->next;
      local_48 = (lws *)(d1 + -0x12);
      plVar5 = d1[6].owner;
      uVar4 = (uint)*(ushort *)((long)nwsi_local + 0x2e6);
      uVar2 = (uint)*(ushort *)((long)&d1[0xc].owner + 6);
      _lws_log(0x10,"%s: check %p %p %s %s %d %d\n","lws_vhost_active_conns",nwsi_local,local_48,w,
               plVar5,uVar4,uVar2);
      if ((local_48 != (lws *)nwsi_local) &&
         ((((lws *)local_48->role_ops == nwsi_local[0x44] ||
           (((local_48->role_ops == &role_ops_h1 || (local_48->role_ops == &role_ops_h2)) &&
            ((nwsi_local[0x44] == (lws *)&role_ops_h1 || (nwsi_local[0x44] == (lws *)&role_ops_h2)))
            ))) && ((((local_48->cli_hostname_copy != (char *)0x0 &&
                      (iVar1 = strcmp((char *)w,local_48->cli_hostname_copy), iVar1 == 0)) &&
                     ((*(uint *)(nwsi_local + 0x57) & 1) == ((local_48->tls).use_ssl & 1))) &&
                    (*(uint16_t *)((long)nwsi_local + 0x2e6) == local_48->c_port)))))) {
        if ((*(ulong *)&local_48->field_0x2dc >> 0x33 & 1) == 0) {
          if ((((*(ulong *)&local_48->field_0x2dc >> 0x36 & 1) != 0) &&
              ((*(ulong *)&local_48->field_0x2dc >> 0x38 & 1) != 0)) &&
             (((local_48->wsistate & 0xffff) == 0x10f ||
              (((local_48->wsistate & 0xffff) == 0x119 || ((local_48->wsistate & 0xffff) == 0x11))))
             )) {
            _lws_log(4,"%s: just join h2 directly 0x%x\n","lws_vhost_active_conns",
                     (ulong)(local_48->wsistate & 0xffff));
            if ((local_48->wsistate & 0xffff) == 0x11) {
              _lws_generic_transaction_completed_active_conn(&local_48);
            }
            *(ulong *)((long)nwsi_local + 0x2dc) =
                 *(ulong *)((long)nwsi_local + 0x2dc) & 0xffbfffffffffffff | 0x40000000000000;
            lws_wsi_h2_adopt(local_48,(lws *)nwsi_local);
            *(lws **)adsin_local = local_48;
            return 1;
          }
          if ((nwsi_local[0x44] == (lws *)&role_ops_mqtt) &&
             ((((*(ulong *)&local_48->field_0x2dc >> 0x38 & 1) != 0 &&
               ((local_48->wsistate & 0xffff) == 0x119)) &&
              (plVar3 = lws_wsi_mqtt_adopt(local_48,(lws *)nwsi_local), plVar3 != (lws *)0x0)))) {
            _lws_log(4,"%s: join mqtt directly\n","lws_vhost_active_conns");
            lws_dll2_remove((lws_dll2 *)(nwsi_local + 0x39));
            *(ulong *)((long)nwsi_local + 0x2dc) =
                 *(ulong *)((long)nwsi_local + 0x2dc) & 0xff7fffffffffffff | 0x80000000000000;
            return 1;
          }
          _lws_log(4,"%s: apply %p to txn queue on %p state 0x%lx\n","lws_vhost_active_conns",
                   nwsi_local,local_48,(ulong)local_48->wsistate,plVar5,uVar4,uVar2);
          lws_dll2_add_tail((lws_dll2 *)(nwsi_local + 0x39),&local_48->dll2_cli_txn_queue_owner);
          if ((local_48->wsistate & 0xffff) == 0x11) {
            _lws_generic_transaction_completed_active_conn(&local_48);
          }
          *(lws **)adsin_local = local_48;
          return 2;
        }
        _lws_log(4,"defeating pipelining due to no keepalive on server\n");
        break;
      }
      d1 = (lws_dll2 *)w_1;
    }
    wsi_local._4_4_ = 0;
  }
  else {
    *(lws **)adsin_local = nwsi_local[0x17];
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_vhost_active_conns(struct lws *wsi, struct lws **nwsi, const char *adsin)
{
	if (!lws_dll2_is_detached(&wsi->dll2_cli_txn_queue)) {
		struct lws *w = lws_container_of(
				wsi->dll2_cli_txn_queue.owner, struct lws,
				dll2_cli_txn_queue_owner);
		*nwsi = w;

		return ACTIVE_CONNS_QUEUED;
	}

#if defined(LWS_ROLE_H2) || defined(LWS_ROLE_MQTT)
	if (wsi->mux.parent_wsi) {
		/*
		 * We already decided...
		 */

		*nwsi = wsi->mux.parent_wsi;

		return ACTIVE_CONNS_MUXED;
	}
#endif

	lws_vhost_lock(wsi->vhost); /* ----------------------------------- { */

	lws_start_foreach_dll_safe(struct lws_dll2 *, d, d1,
				   wsi->vhost->dll_cli_active_conns_owner.head) {
		struct lws *w = lws_container_of(d, struct lws,
						 dll_cli_active_conns);

		lwsl_debug("%s: check %p %p %s %s %d %d\n", __func__, wsi, w,
			    adsin, w->cli_hostname_copy, wsi->c_port, w->c_port);

		if (w != wsi &&
		    /*
		     * "same internet protocol"... this is a bit tricky,
		     * since h2 start out as h1
		     */
		    (w->role_ops == wsi->role_ops ||
		     (lwsi_role_http(w) && lwsi_role_http(wsi))) &&
		    w->cli_hostname_copy &&
		    !strcmp(adsin, w->cli_hostname_copy) &&
#if defined(LWS_WITH_TLS)
		    (wsi->tls.use_ssl & LCCSCF_USE_SSL) ==
		     (w->tls.use_ssl & LCCSCF_USE_SSL) &&
#endif
		    wsi->c_port == w->c_port) {

			/*
			 * There's already an active connection.
			 *
			 * The server may have told the existing active
			 * connection that it doesn't support pipelining...
			 */
			if (w->keepalive_rejected) {
				lwsl_notice("defeating pipelining due to no "
					  "keepalive on server\n");
				goto solo;
			}

#if defined(LWS_WITH_HTTP2)
			/*
			 * h2: if in usable state already: just use it without
			 *     going through the queue
			 */
			if (w->client_h2_alpn && w->client_mux_migrated &&
			    (lwsi_state(w) == LRS_H2_WAITING_TO_SEND_HEADERS ||
			     lwsi_state(w) == LRS_ESTABLISHED ||
			     lwsi_state(w) == LRS_IDLING)) {

				lwsl_notice("%s: just join h2 directly 0x%x\n",
						__func__, lwsi_state(w));

				if (lwsi_state(w) == LRS_IDLING) {
					// lwsi_set_state(w, LRS_ESTABLISHED);
					_lws_generic_transaction_completed_active_conn(&w);
				}

				//lwsi_set_state(w, LRS_H1C_ISSUE_HANDSHAKE2);

				wsi->client_h2_alpn = 1;
				lws_wsi_h2_adopt(w, wsi);
				lws_vhost_unlock(wsi->vhost); /* } ---------- */

				*nwsi = w;

				return ACTIVE_CONNS_MUXED;
			}
#endif

#if defined(LWS_ROLE_MQTT)
			/*
			 * MQTT: if in usable state already: just use it without
			 *	 going through the queue
			 */

			if (lwsi_role_mqtt(wsi) && w->client_mux_migrated &&
			    lwsi_state(w) == LRS_ESTABLISHED) {

				if (lws_wsi_mqtt_adopt(w, wsi)) {
					lwsl_notice("%s: join mqtt directly\n", __func__);
					lws_dll2_remove(&wsi->dll2_cli_txn_queue);
					wsi->client_mux_substream = 1;

					lws_vhost_unlock(wsi->vhost); /* } ---------- */


					return ACTIVE_CONNS_MUXED;
				}
			}
#endif

			/*
			 * If the connection is viable but not yet in a usable
			 * state, let's attach ourselves to it and wait for it
			 * to get there or fail.
			 */

			lwsl_notice("%s: apply %p to txn queue on %p state 0x%lx\n",
				  __func__, wsi, w, (unsigned long)w->wsistate);
			/*
			 * ...let's add ourselves to his transaction queue...
			 * we are adding ourselves at the TAIL
			 */
			lws_dll2_add_tail(&wsi->dll2_cli_txn_queue,
					  &w->dll2_cli_txn_queue_owner);

			if (lwsi_state(w) == LRS_IDLING) {
				// lwsi_set_state(w, LRS_ESTABLISHED);
				_lws_generic_transaction_completed_active_conn(&w);
			}

			/*
			 * For eg, h1 next we'd pipeline our headers out on him,
			 * and wait for our turn at client transaction_complete
			 * to take over parsing the rx.
			 */
			lws_vhost_unlock(wsi->vhost); /* } ---------- */

			*nwsi = w;

			return ACTIVE_CONNS_QUEUED;
		}

	} lws_end_foreach_dll_safe(d, d1);

solo:
	lws_vhost_unlock(wsi->vhost); /* } ---------------------------------- */

	/* there is nobody already connected in the same way */

	return ACTIVE_CONNS_SOLO;
}